

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

LY_ERR lyb_read_start_siblings(lylyb_ctx *lybctx)

{
  lyd_lyb_sibling *plVar1;
  undefined8 in_RAX;
  long *plVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint8_t meta_buf [4];
  undefined4 local_24;
  
  local_24 = (undefined4)((ulong)in_RAX >> 0x20);
  plVar1 = lybctx->siblings;
  if (plVar1 == (lyd_lyb_sibling *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(uint64_t *)&plVar1[-1].inner_chunks;
  }
  if (uVar4 == lybctx->sibling_size) {
    if (plVar1 == (lyd_lyb_sibling *)0x0) {
      plVar2 = (long *)calloc(1,uVar4 * 0x18 + 0x68);
    }
    else {
      plVar2 = (long *)realloc(&plVar1[-1].inner_chunks,
                               (*(long *)&plVar1[-1].inner_chunks + uVar4) * 0x18 + 0x68);
    }
    if (plVar2 == (long *)0x0) {
      ly_log(lybctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyb_read_start_siblings");
      return LY_EMEM;
    }
    lybctx->siblings = (lyd_lyb_sibling *)(plVar2 + 1);
    memset(plVar2 + *plVar2 * 3 + 1,0,uVar4 * 0x18 + 0x60);
    lybctx->sibling_size = uVar4 + 4;
  }
  plVar1 = lybctx->siblings;
  uVar3 = *(ulong *)&plVar1[-1].inner_chunks;
  *(ulong *)&plVar1[-1].inner_chunks = uVar3 + 1;
  uVar3 = -(ulong)(plVar1 == (lyd_lyb_sibling *)0x0) | uVar3;
  ly_in_read(lybctx->in,&local_24,4);
  plVar1[uVar3].written = (ulong)(ushort)local_24;
  plVar1[uVar3].inner_chunks = local_24._2_2_;
  plVar1[uVar3].position = (ulong)((ulong)(ushort)local_24 == 0xffff);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyb_read_start_siblings(struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;

    u = LY_ARRAY_COUNT(lybctx->siblings);
    if (u == lybctx->sibling_size) {
        LY_ARRAY_CREATE_RET(lybctx->ctx, lybctx->siblings, u + LYB_SIBLING_STEP, LY_EMEM);
        lybctx->sibling_size = u + LYB_SIBLING_STEP;
    }

    LY_ARRAY_INCREMENT(lybctx->siblings);
    lyb_read_sibling_meta(&LYB_LAST_SIBLING(lybctx), lybctx);

    return LY_SUCCESS;
}